

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O0

void __thiscall setup::item::load_condition_data(item *this,istream *is,info *i)

{
  bool bVar1;
  uint uVar2;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  string *in_RDI;
  encoded_string *in_stack_ffffffffffffff18;
  istream *in_stack_ffffffffffffff20;
  encoded_string local_a8;
  encoded_string local_90;
  encoded_string local_78;
  encoded_string local_60;
  encoded_string local_48;
  encoded_string local_30;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x1ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_ffffffffffffff20), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10307ff < uVar2))
     )) {
    util::encoded_string::encoded_string(&local_30,in_RDI,local_18[6].value_);
    util::operator>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    std::__cxx11::string::clear();
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x1ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_ffffffffffffff20), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10310ff < uVar2))
     )) {
    util::encoded_string::encoded_string(&local_48,in_RDI + 1,local_18[6].value_);
    util::operator>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    std::__cxx11::string::clear();
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4000100) {
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string(&local_60,in_RDI + 2,local_18[6].value_);
    util::operator>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x3ffffff < uVar2) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_ffffffffffffff20), bVar1 &&
      (uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10317ff < uVar2))
     )) {
    util::encoded_string::encoded_string(&local_78,in_RDI + 3,local_18[6].value_);
    util::operator>>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    std::__cxx11::string::clear();
  }
  uVar2 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar2 < 0x4010000) {
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
  }
  else {
    util::encoded_string::encoded_string(&local_90,in_RDI + 4,local_18[6].value_);
    util::operator>>(local_10,in_stack_ffffffffffffff18);
    util::encoded_string::encoded_string(&local_a8,in_RDI + 5,local_18[6].value_);
    util::operator>>(local_10,in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

void item::load_condition_data(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 8))) {
		is >> util::encoded_string(components, i.codepage);
	} else {
		components.clear();
	}
	if(i.version >= INNO_VERSION(2, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 17))) {
		is >> util::encoded_string(tasks, i.codepage);
	} else {
		tasks.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		is >> util::encoded_string(after_install, i.codepage);
		is >> util::encoded_string(before_install, i.codepage);
	} else {
		after_install.clear(), before_install.clear();
	}
	
}